

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::fromUtf8(QByteArrayView ba)

{
  long lVar1;
  QByteArrayView in;
  bool bVar2;
  storage_type *in_RSI;
  DataPointer *in_RDI;
  long in_FS_OFFSET;
  DataPointer *this;
  DataPointer *rawData;
  qsizetype in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  rawData = in_RDI;
  bVar2 = QByteArrayView::isNull((QByteArrayView *)&stack0xffffffffffffffe8);
  if (bVar2) {
    QString((QString *)0x156f7a);
  }
  else {
    bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x156f86);
    if (bVar2) {
      QArrayDataPointer<char16_t>::fromRawData((char16_t *)rawData,(qsizetype)this);
      QString((QString *)this,in_RDI);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
    }
    else {
      in.m_data = in_RSI;
      in.m_size = in_stack_ffffffffffffffe0;
      QUtf8::convertToUnicode(in);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::fromUtf8(QByteArrayView ba)
{
    if (ba.isNull())
        return QString();
    if (ba.isEmpty())
        return QString(DataPointer::fromRawData(&_empty, 0));
    return QUtf8::convertToUnicode(ba);
}